

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::processBrokerConfigureCommands(CoreBroker *this,ActionMessage *cmd)

{
  int iVar1;
  string_view lfile;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type local_80;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  callback;
  optional<std::any> locker;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = cmd->messageID;
  if (iVar1 != 0x2f) {
    if (iVar1 == 0x25f) {
      if ((cmd->flags & 0x20) != 0) {
        BrokerBase::setTickForwarding(&this->super_BrokerBase,PING_RESPONSE,true);
        return;
      }
    }
    else if (iVar1 == 0x250) {
      if ((short)cmd->flags < 0) {
        local_28 = 0;
        uStack_20 = 0;
        local_38._M_unused._M_object = (void *)0x0;
        local_38._8_8_ = 0;
        BrokerBase::setLoggerFunction
                  (&this->super_BrokerBase,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_38);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
      }
      else {
        gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                  ((optional<std::any> *)&locker,(this->dataAirlocks)._M_elems + cmd->counter);
        if (locker.super__Optional_base<std::any,_false,_false>._M_payload.
            super__Optional_payload<std::any,_true,_false,_false>.
            super__Optional_payload_base<std::any>._M_engaged == true) {
          std::
          any_cast<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                    ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&callback,(any *)&locker);
          __args_1._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          __args_1._M_len = (this->super_BrokerBase).identifier._M_string_length;
          __args_2._M_str = "logging callback activated";
          __args_2._M_len = 0x1a;
          std::
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&callback,0,__args_1,__args_2);
          local_98._M_unused._M_object = (void *)0x0;
          local_98._8_8_ = 0;
          local_88 = (_Manager_type)0x0;
          local_80 = callback._M_invoker;
          if (callback.super__Function_base._M_manager != (_Manager_type)0x0) {
            local_98._M_unused._M_object =
                 callback.super__Function_base._M_functor._M_unused._M_object;
            local_98._8_8_ = callback.super__Function_base._M_functor._8_8_;
            local_88 = callback.super__Function_base._M_manager;
            callback.super__Function_base._M_manager = (_Manager_type)0x0;
            callback._M_invoker = (_Invoker_type)0x0;
          }
          BrokerBase::setLoggerFunction
                    (&this->super_BrokerBase,
                     (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&local_98);
          CLI::std::_Function_base::~_Function_base((_Function_base *)&local_98);
          CLI::std::_Function_base::~_Function_base(&callback.super__Function_base);
        }
        std::_Optional_payload_base<std::any>::_M_reset((_Optional_payload_base<std::any> *)&locker)
        ;
      }
    }
    else {
      if (iVar1 == 0x252) {
        lfile._M_str = (char *)(cmd->payload).heap;
        lfile._M_len = (cmd->payload).bufferSize;
        BrokerBase::setLoggingFile(&this->super_BrokerBase,lfile);
        return;
      }
      if (iVar1 == 0x10f) goto LAB_00281ce7;
    }
    return;
  }
LAB_00281ce7:
  BrokerBase::setLogLevel(&this->super_BrokerBase,(cmd->dest_handle).hid);
  return;
}

Assistant:

void CoreBroker::processBrokerConfigureCommands(ActionMessage& cmd)
{
    switch (cmd.messageID) {
        case defs::Flags::ENABLE_INIT_ENTRY:
            /*if (delayInitCounter <= 1)
        {
            delayInitCounter = 0;
            if (allInitReady())
            {
                BrokerState exp = CONNECTED;
                if (brokerState.compare_exchange_strong(exp, BrokerState::INITIALIZING))
                {  // make sure we only do this once
                    checkDependencies();
                    cmd.setAction(CMD_INIT);
                    cmd.source_id = global_broker_id_local;
                    cmd.dest_id = 0;
                    transmit(0, cmd);
                }
            }
        }
        else
        {
            --delayInitCounter;
        }
        break;
        */
        case defs::Properties::LOG_LEVEL:
            setLogLevel(cmd.getExtraData());
            break;
        case UPDATE_LOGGING_CALLBACK:
            if (checkActionFlag(cmd, empty_flag)) {
                setLoggerFunction(nullptr);
            } else {
                auto locker = dataAirlocks[cmd.counter].try_unload();
                if (locker) {
                    try {
                        auto callback = std::any_cast<
                            std::function<void(int, std::string_view, std::string_view)>>(
                            std::move(*locker));
                        callback(0, identifier, "logging callback activated");
                        setLoggerFunction(std::move(callback));
                    }
                    catch (const std::bad_any_cast&) {
                        // This shouldn't really happen unless someone is being malicious so just
                        // ignore it for now.
                        ;
                    }
                }
            }
            break;
        case UPDATE_LOGGING_FILE:
            setLoggingFile(cmd.payload.to_string());
            break;
        case REQUEST_TICK_FORWARDING:
            if (checkActionFlag(cmd, indicator_flag)) {
                setTickForwarding(TickForwardingReasons::PING_RESPONSE, true);
            }
            break;
        default:
            break;
    }
}